

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Deserializer::ReadVariableData(ByteData *__return_storage_ptr__,Deserializer *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  Deserializer *local_18;
  Deserializer *this_local;
  
  local_18 = this;
  this_local = (Deserializer *)__return_storage_ptr__;
  ReadVariableBuffer(&local_30,this);
  ByteData::ByteData(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData Deserializer::ReadVariableData() {
  return ByteData(ReadVariableBuffer());
}